

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HSimplexNla.cpp
# Opt level: O0

void __thiscall
HSimplexNla::reportPackValue(HSimplexNla *this,string *message,HVector *vector,bool force)

{
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> begin;
  undefined8 uVar1;
  uint *puVar2;
  const_reference pvVar3;
  byte in_CL;
  long in_RDX;
  string *in_RSI;
  long in_RDI;
  HighsInt iRow;
  HighsInt en;
  vector<int,_std::allocator<int>_> sorted_index;
  string *in_stack_00000318;
  undefined1 in_stack_00000327;
  vector<double,_std::allocator<double>_> *in_stack_00000328;
  HighsInt in_stack_00000334;
  string *in_stack_00000338;
  HighsLogOptions *in_stack_00000340;
  vector<int,_std::allocator<int>_> *in_stack_ffffffffffffff18;
  undefined4 in_stack_ffffffffffffff20;
  undefined4 in_stack_ffffffffffffff24;
  uint uVar4;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> end;
  undefined4 in_stack_ffffffffffffff30;
  undefined4 in_stack_ffffffffffffff34;
  int local_ac;
  vector<int,_std::allocator<int>_> *in_stack_ffffffffffffff68;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> in_stack_ffffffffffffff70;
  allocator local_61;
  string local_60 [32];
  string local_40 [39];
  byte local_19;
  long local_18;
  
  local_19 = in_CL & 1;
  if (((*(byte *)(in_RDI + 0x7a8) & 1) != 0) || (local_19 != 0)) {
    if (*(int *)(in_RDX + 0x7c) < 0x1a) {
      local_18 = in_RDX;
      uVar1 = std::__cxx11::string::c_str();
      printf("%s",uVar1);
      end._M_current = (int *)&stack0xffffffffffffff70;
      std::vector<int,_std::allocator<int>_>::vector
                ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffff70._M_current,
                 in_stack_ffffffffffffff68);
      std::vector<int,_std::allocator<int>_>::begin(in_stack_ffffffffffffff18);
      std::vector<int,_std::allocator<int>_>::begin(in_stack_ffffffffffffff18);
      __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator+
                ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)end._M_current
                 ,CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20));
      begin._M_current._4_4_ = in_stack_ffffffffffffff34;
      begin._M_current._0_4_ = in_stack_ffffffffffffff30;
      pdqsort<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>(begin,end);
      for (local_ac = 0; local_ac < *(int *)(local_18 + 0x7c); local_ac = local_ac + 1) {
        puVar2 = (uint *)std::vector<int,_std::allocator<int>_>::operator[]
                                   ((vector<int,_std::allocator<int>_> *)&stack0xffffffffffffff70,
                                    (long)local_ac);
        uVar4 = *puVar2;
        if (local_ac % 5 == 0) {
          printf("\n");
        }
        pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)(local_18 + 0x98),
                            (long)local_ac);
        printf("[%4d %11.4g] ",*pvVar3,(ulong)uVar4);
      }
      printf("\n");
      std::vector<int,_std::allocator<int>_>::~vector
                ((vector<int,_std::allocator<int>_> *)
                 CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30));
    }
    else {
      std::__cxx11::string::string(local_40,in_RSI);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_60,"Unknown",&local_61);
      analyseVectorValues(in_stack_00000340,in_stack_00000338,in_stack_00000334,in_stack_00000328,
                          (bool)in_stack_00000327,in_stack_00000318);
      std::__cxx11::string::~string(local_60);
      std::allocator<char>::~allocator((allocator<char> *)&local_61);
      std::__cxx11::string::~string(local_40);
    }
  }
  return;
}

Assistant:

void HSimplexNla::reportPackValue(const std::string message,
                                  const HVector* vector,
                                  const bool force) const {
  if (!report_ && !force) return;
  if (vector->packCount > kReportItemLimit) {
    analyseVectorValues(nullptr, message, vector->packCount, vector->packValue,
                        true);
    return;
  }
  printf("%s", message.c_str());
  std::vector<HighsInt> sorted_index = vector->packIndex;
  pdqsort(sorted_index.begin(), sorted_index.begin() + vector->packCount);
  for (HighsInt en = 0; en < vector->packCount; en++) {
    HighsInt iRow = sorted_index[en];
    if (en % 5 == 0) printf("\n");
    printf("[%4d %11.4g] ", (int)iRow, vector->packValue[en]);
  }
  printf("\n");
}